

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

size_t inform_dist_accumulate(inform_dist *dist,int *events,size_t n)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (((events == (int *)0x0 || dist == (inform_dist *)0x0) || (sVar2 = dist->size, sVar2 == 0)) ||
     (n == 0)) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    while( true ) {
      uVar1 = events[sVar3];
      if (((int)sVar2 <= (int)uVar1) || ((int)uVar1 < 0)) break;
      dist->histogram[uVar1] = dist->histogram[uVar1] + 1;
      dist->counts = dist->counts + 1;
      sVar3 = sVar3 + 1;
      if (n == sVar3) {
        return n;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t inform_dist_accumulate(inform_dist *dist, int const *events, size_t n)
{
    // if the distribution is invalid or no events were provided
    if (dist == NULL || events == NULL || dist->size == 0)
    {
        return 0;
    }
    // loop over the events and add them to the distribution
    int const size = (int)dist->size;
    size_t i = 0;
    while (i < n)
    {
        if (size <= *events || *events < 0) break;
        dist->histogram[*events] += 1;
        dist->counts += 1;
        ++events;
        ++i;
    }
    return i;
}